

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

void __thiscall GraphBuilder::printEdges(GraphBuilder *this,ostream *ostream)

{
  __node_base *p_Var1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->llvmToNodeMap_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    (*(code *)(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)->
              _M_nxt[4]._M_nxt)
              (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor,
               ostream);
  }
  p_Var1 = &(this->artificialNodes_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    (*(code *)(p_Var1[1]._M_nxt)->_M_nxt[4]._M_nxt)(p_Var1[1]._M_nxt,ostream);
  }
  return;
}

Assistant:

void GraphBuilder::printEdges(std::ostream &ostream) const {
    for (const auto &iterator : llvmToNodeMap_) {
        iterator.second->printOutcomingEdges(ostream);
    }
    for (const auto &iterator : artificialNodes_) {
        iterator->printOutcomingEdges(ostream);
    }
}